

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void lodepng_color_mode_alloc_palette(LodePNGColorMode *info)

{
  void *pvVar1;
  long in_RDI;
  size_t i;
  undefined8 local_10;
  
  if (*(long *)(in_RDI + 8) == 0) {
    pvVar1 = lodepng_malloc(0x3472cf);
    *(void **)(in_RDI + 8) = pvVar1;
  }
  if (*(long *)(in_RDI + 8) != 0) {
    for (local_10 = 0; local_10 != 0x100; local_10 = local_10 + 1) {
      *(undefined1 *)(*(long *)(in_RDI + 8) + local_10 * 4) = 0;
      *(undefined1 *)(*(long *)(in_RDI + 8) + 1 + local_10 * 4) = 0;
      *(undefined1 *)(*(long *)(in_RDI + 8) + 2 + local_10 * 4) = 0;
      *(undefined1 *)(*(long *)(in_RDI + 8) + 3 + local_10 * 4) = 0xff;
    }
  }
  return;
}

Assistant:

static void lodepng_color_mode_alloc_palette(LodePNGColorMode* info) {
  size_t i;
  /*if the palette is already allocated, it will have size 1024 so no reallocation needed in that case*/
  /*the palette must have room for up to 256 colors with 4 bytes each.*/
  if(!info->palette) info->palette = (unsigned char*)lodepng_malloc(1024);
  if(!info->palette) return; /*alloc fail*/
  for(i = 0; i != 256; ++i) {
    /*Initialize all unused colors with black, the value used for invalid palette indices.
    This is an error according to the PNG spec, but common PNG decoders make it black instead.
    That makes color conversion slightly faster due to no error handling needed.*/
    info->palette[i * 4 + 0] = 0;
    info->palette[i * 4 + 1] = 0;
    info->palette[i * 4 + 2] = 0;
    info->palette[i * 4 + 3] = 255;
  }
}